

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

void __thiscall Js::FunctionBody::SetSimpleJitCallCount(FunctionBody *this,uint16 simpleJitLimit)

{
  code *pcVar1;
  ExecutionMode EVar2;
  bool bVar3;
  ushort uVar4;
  undefined4 *puVar5;
  FunctionEntryPointInfo *pFVar6;
  FunctionEntryPointInfo *pFVar7;
  Type TVar8;
  
  EVar2 = FunctionExecutionStateMachine::GetExecutionMode(&this->executionState);
  if (EVar2 != SimpleJit) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1b8a,"(GetExecutionMode() == ExecutionMode::SimpleJit)",
                                "GetExecutionMode() == ExecutionMode::SimpleJit");
    if (!bVar3) goto LAB_006d5430;
    *puVar5 = 0;
  }
  pFVar6 = GetDefaultFunctionEntryPointInfo(this);
  pFVar7 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)6,Js::FunctionEntryPointInfo*>
                     ((FunctionProxy *)this);
  if (pFVar6 != pFVar7) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1b8b,
                                "(GetDefaultFunctionEntryPointInfo() == GetSimpleJitEntryPointInfo())"
                                ,
                                "GetDefaultFunctionEntryPointInfo() == GetSimpleJitEntryPointInfo()"
                               );
    if (!bVar3) {
LAB_006d5430:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  uVar4 = 0xff;
  if (simpleJitLimit < 0xff) {
    uVar4 = simpleJitLimit;
  }
  TVar8 = 0;
  if (simpleJitLimit != 0) {
    TVar8 = uVar4 - 1;
  }
  pFVar6 = FunctionProxy::
           GetAuxPtr<(Js::FunctionProxy::AuxPointerType)6,Js::FunctionEntryPointInfo*>
                     ((FunctionProxy *)this);
  pFVar6->callsCount = TVar8;
  return;
}

Assistant:

void FunctionBody::SetSimpleJitCallCount(const uint16 simpleJitLimit) const
    {
        Assert(GetExecutionMode() == ExecutionMode::SimpleJit);
        Assert(GetDefaultFunctionEntryPointInfo() == GetSimpleJitEntryPointInfo());

        // Simple JIT counts down and transitions on overflow
        const uint8 limit = static_cast<uint8>(min(0xffui16, simpleJitLimit));
        GetSimpleJitEntryPointInfo()->callsCount = limit == 0 ? 0 : limit - 1;
    }